

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

CivilInfo * __thiscall
absl::lts_20250127::TimeZone::At(CivilInfo *__return_storage_ptr__,TimeZone *this,Time t)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  this_00;
  uint uVar1;
  bool bVar2;
  uint32_t lo;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  Time TVar3;
  Duration DVar4;
  Duration d;
  HiRep local_1b8;
  uint32_t local_1b0;
  civil_time<absl::lts_20250127::time_internal::second_tag> local_180;
  undefined1 local_170 [8];
  absolute_lookup al;
  int64_t local_130;
  duration<long,std::ratio<1l,1l>> local_128 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  local_120;
  time_point<seconds> local_118;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  uint local_108;
  Duration ud;
  TimeZone *this_local;
  Time t_local;
  
  TVar3 = InfiniteFuture();
  bVar2 = lts_20250127::operator==(t,TVar3);
  if (bVar2) {
    anon_unknown_8::InfiniteFutureCivilInfo();
  }
  else {
    TVar3 = InfinitePast();
    bVar2 = lts_20250127::operator==(t,TVar3);
    if (bVar2) {
      anon_unknown_8::InfinitePastCivilInfo();
    }
    else {
      TVar3.rep_.rep_hi_.hi_ = 0;
      TVar3.rep_.rep_hi_.lo_ = t.rep_.rep_lo_;
      TVar3.rep_.rep_lo_ = (uint32_t)extraout_RDX;
      _tp = time_internal::ToUnixDuration((time_internal *)t.rep_.rep_hi_,TVar3);
      uVar1 = local_108;
      this_00.__d.__r = tp.__d.__r;
      local_120.__d.__r = (duration)anon_unknown_8::unix_epoch();
      al.abbr = (char *)this_00.__d.__r;
      DVar4.rep_hi_.hi_ = 0;
      DVar4.rep_hi_.lo_ = uVar1;
      DVar4.rep_lo_ = (uint32_t)extraout_RDX_00;
      local_130 = time_internal::GetRepHi((time_internal *)this_00.__d.__r,DVar4);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>(local_128,&local_130);
      local_118.__d.__r =
           (duration)
           std::chrono::operator+(&local_120,(duration<long,_std::ratio<1L,_1L>_> *)local_128);
      time_internal::cctz::time_zone::lookup
                ((absolute_lookup *)local_170,(time_zone *)this,&local_118);
      CivilInfo::CivilInfo(__return_storage_ptr__);
      time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::second_tag>::
      civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                (&local_180,
                 (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                 local_170,
                 (preserves_data<absl::lts_20250127::time_internal::cctz::detail::second_tag,_absl::lts_20250127::time_internal::second_tag>
                  *)0x0);
      (__return_storage_ptr__->cs).f_.y = local_180.f_.y;
      (__return_storage_ptr__->cs).f_.m = local_180.f_.m;
      (__return_storage_ptr__->cs).f_.d = local_180.f_.d;
      (__return_storage_ptr__->cs).f_.hh = local_180.f_.hh;
      (__return_storage_ptr__->cs).f_.mm = local_180.f_.mm;
      (__return_storage_ptr__->cs).f_.ss = local_180.f_.ss;
      *(undefined3 *)&(__return_storage_ptr__->cs).f_.field_0xd = local_180.f_._13_3_;
      d.rep_hi_.hi_ = 0;
      d.rep_hi_.lo_ = uVar1;
      d.rep_lo_ = (uint32_t)extraout_RDX_01;
      lo = time_internal::GetRepLo((time_internal *)this_00.__d.__r,d);
      DVar4 = time_internal::MakeDuration(0,lo);
      local_1b8 = DVar4.rep_hi_;
      local_1b0 = DVar4.rep_lo_;
      (__return_storage_ptr__->subsecond).rep_hi_ = local_1b8;
      (__return_storage_ptr__->subsecond).rep_lo_ = local_1b0;
      __return_storage_ptr__->offset = al.cs.f_._8_4_;
      __return_storage_ptr__->is_dst = (bool)(al.cs.f_.ss & 1);
      __return_storage_ptr__->zone_abbr = (char *)al._16_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::TimeZone::CivilInfo TimeZone::At(Time t) const {
  if (t == absl::InfiniteFuture()) return InfiniteFutureCivilInfo();
  if (t == absl::InfinitePast()) return InfinitePastCivilInfo();

  const auto ud = time_internal::ToUnixDuration(t);
  const auto tp = unix_epoch() + cctz::seconds(time_internal::GetRepHi(ud));
  const auto al = cz_.lookup(tp);

  TimeZone::CivilInfo ci;
  ci.cs = CivilSecond(al.cs);
  ci.subsecond = time_internal::MakeDuration(0, time_internal::GetRepLo(ud));
  ci.offset = al.offset;
  ci.is_dst = al.is_dst;
  ci.zone_abbr = al.abbr;
  return ci;
}